

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

CRef __thiscall Glucose::Solver::propagate(Solver *this)

{
  Watcher WVar1;
  Watcher WVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Lit *pLVar6;
  Watcher *pWVar7;
  Lit *pLVar8;
  Solver *in_RDI;
  int k_2;
  int k_1;
  int choosenPos;
  Watcher w;
  Lit first;
  Lit false_lit;
  Clause *c;
  CRef cr;
  Lit blocker;
  Lit imp;
  int k;
  vec<Glucose::Solver::Watcher> *wbin;
  Watcher *end;
  Watcher *j;
  Watcher *i;
  vec<Glucose::Solver::Watcher> *ws;
  Lit p;
  int num_props;
  CRef confl;
  undefined4 in_stack_fffffffffffffe98;
  Ref in_stack_fffffffffffffe9c;
  vec<Glucose::Solver::Watcher> *in_stack_fffffffffffffea0;
  Solver *in_stack_fffffffffffffea8;
  Lit in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  byte local_135;
  CRef in_stack_fffffffffffffed4;
  Solver *in_stack_fffffffffffffed8;
  Watcher *in_stack_fffffffffffffee0;
  lbool local_fd;
  int local_fc;
  lbool local_f5;
  int local_f4;
  int local_f0;
  lbool local_e9;
  int local_e8;
  uint8_t local_e1;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  lbool local_cd;
  int local_cc;
  lbool local_c6;
  lbool local_c5;
  int local_c4;
  uint8_t local_bd;
  int local_bc;
  int local_b8;
  lbool local_b1;
  int local_b0;
  lbool local_a9;
  Lit in_stack_ffffffffffffff58;
  Lit in_stack_ffffffffffffff5c;
  CRef local_a0;
  Lit in_stack_ffffffffffffff64;
  Lit local_98;
  int local_94;
  int local_90;
  Lit local_8c;
  Clause *local_88;
  CRef local_7c;
  lbool local_75;
  int local_74;
  lbool local_6d;
  Lit local_6c;
  int local_68;
  lbool local_61;
  int local_60;
  lbool local_5a;
  lbool local_59;
  int local_58;
  lbool local_51;
  int local_50;
  int local_4c;
  vec<Glucose::Solver::Watcher> *local_48;
  Watcher *local_40;
  Watcher *local_38;
  Watcher *local_30;
  vec<Glucose::Solver::Watcher> *local_28;
  Lit local_1c;
  int local_18;
  CRef local_14;
  
  local_14 = 0xffffffff;
  local_18 = 0;
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
            *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0.x));
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
            *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0.x));
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
            *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0.x));
  do {
    iVar5 = in_RDI->qhead;
    iVar4 = vec<Glucose::Lit>::size(&in_RDI->trail);
    if (iVar4 <= iVar5) {
      in_RDI->propagations = (long)local_18 + in_RDI->propagations;
      in_RDI->simpDB_props = in_RDI->simpDB_props - (long)local_18;
      return local_14;
    }
    iVar5 = in_RDI->qhead;
    in_RDI->qhead = iVar5 + 1;
    pLVar6 = vec<Glucose::Lit>::operator[](&in_RDI->trail,iVar5);
    local_1c.x = pLVar6->x;
    local_28 = OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
               ::operator[]((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
                             *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0.x),
                            (Lit *)in_stack_fffffffffffffea8);
    local_18 = local_18 + 1;
    local_48 = OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
               ::operator[]((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
                             *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0.x),
                            (Lit *)in_stack_fffffffffffffea8);
    for (local_4c = 0; iVar5 = local_4c, iVar4 = vec<Glucose::Solver::Watcher>::size(local_48),
        iVar5 < iVar4; local_4c = local_4c + 1) {
      pWVar7 = vec<Glucose::Solver::Watcher>::operator[](local_48,local_4c);
      local_58 = (pWVar7->blocker).x;
      local_50 = local_58;
      local_51 = value(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
      lbool::lbool(&local_59,'\x01');
      bVar3 = lbool::operator==(&local_51,local_59);
      if (bVar3) {
        pWVar7 = vec<Glucose::Solver::Watcher>::operator[](local_48,local_4c);
        return pWVar7->cref;
      }
      local_60 = local_50;
      local_5a = value(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
      lbool::lbool(&local_61,'\x02');
      bVar3 = lbool::operator==(&local_5a,local_61);
      if (bVar3) {
        local_68 = local_50;
        vec<Glucose::Solver::Watcher>::operator[](local_48,local_4c);
        uncheckedEnqueue(in_stack_fffffffffffffed8,
                         (Lit)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                         in_stack_fffffffffffffed4);
      }
    }
    in_stack_fffffffffffffee0 = Glucose::vec::operator_cast_to_Watcher_((vec *)local_28);
    local_38 = in_stack_fffffffffffffee0;
    local_30 = in_stack_fffffffffffffee0;
    iVar5 = vec<Glucose::Solver::Watcher>::size(local_28);
    local_40 = in_stack_fffffffffffffee0 + iVar5;
LAB_0012057e:
    if (local_30 != local_40) {
      local_74 = (local_30->blocker).x;
      local_6c.x = local_74;
      local_6d = value(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
      lbool::lbool(&local_75,'\0');
      bVar3 = lbool::operator==(&local_6d,local_75);
      if (bVar3) {
        *local_38 = *local_30;
        local_38 = local_38 + 1;
        local_30 = local_30 + 1;
      }
      else {
        local_7c = local_30->cref;
        local_88 = ClauseAllocator::operator[]
                             ((ClauseAllocator *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c
                             );
        local_90 = local_1c.x;
        local_8c = operator~(local_1c);
        pLVar6 = Clause::operator[](local_88,0);
        local_94 = local_8c.x;
        bVar3 = Lit::operator==(pLVar6,local_8c);
        if (bVar3) {
          in_stack_fffffffffffffed8 = (Solver *)Clause::operator[](local_88,1);
          pLVar6 = Clause::operator[](local_88,0);
          pLVar6->x = *(int *)&(in_stack_fffffffffffffed8->super_Clone)._vptr_Clone;
          pLVar6 = Clause::operator[](local_88,1);
          pLVar6->x = local_8c.x;
        }
        local_30 = local_30 + 1;
        pLVar6 = Clause::operator[](local_88,0);
        in_stack_ffffffffffffff5c.x = pLVar6->x;
        local_98.x = in_stack_ffffffffffffff5c.x;
        Watcher::Watcher((Watcher *)&local_a0,local_7c,in_stack_ffffffffffffff5c);
        in_stack_ffffffffffffff58.x = local_6c.x;
        bVar3 = Lit::operator!=(&local_98,local_6c);
        in_stack_fffffffffffffed4 = in_stack_fffffffffffffed4 & 0xffffff;
        if (bVar3) {
          local_b0 = local_98.x;
          local_a9 = value(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
          lbool::lbool(&local_b1,'\0');
          bVar3 = lbool::operator==(&local_a9,local_b1);
          in_stack_fffffffffffffed4 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffed4);
        }
        if ((char)(in_stack_fffffffffffffed4 >> 0x18) == '\0') {
          if (in_RDI->incremental == 0) {
            local_e0 = 2;
            while (in_stack_fffffffffffffeb4 = local_e0, iVar5 = Clause::size(local_88),
                  in_stack_fffffffffffffeb4 < iVar5) {
              pLVar6 = Clause::operator[](local_88,local_e0);
              local_e8 = pLVar6->x;
              local_e1 = (uint8_t)value(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
              lbool::lbool(&local_e9,'\x01');
              bVar3 = lbool::operator!=((lbool *)CONCAT44(in_stack_fffffffffffffe9c,
                                                          in_stack_fffffffffffffe98),
                                        (lbool)(uint8_t)((ulong)in_stack_fffffffffffffea0 >> 0x38));
              if (bVar3) {
                in_stack_fffffffffffffea0 =
                     (vec<Glucose::Solver::Watcher> *)Clause::operator[](local_88,local_e0);
                pLVar6 = Clause::operator[](local_88,1);
                pLVar6->x = *(int *)&in_stack_fffffffffffffea0->data;
                pLVar6 = Clause::operator[](local_88,local_e0);
                pLVar6->x = local_8c.x;
                in_stack_fffffffffffffea8 = (Solver *)&in_RDI->watches;
                pLVar6 = Clause::operator[](local_88,1);
                local_f4 = pLVar6->x;
                local_f0 = (int)operator~((Lit)local_f4);
                OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
                ::operator[]((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
                              *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0.x),
                             (Lit *)in_stack_fffffffffffffea8);
                vec<Glucose::Solver::Watcher>::push
                          (in_stack_fffffffffffffea0,
                           (Watcher *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
                ;
                goto LAB_0012057e;
              }
              local_e0 = local_e0 + 1;
            }
          }
          else {
            local_b8 = -1;
            for (local_bc = 2; iVar5 = local_bc, iVar4 = Clause::size(local_88), iVar5 < iVar4;
                local_bc = local_bc + 1) {
              pLVar6 = Clause::operator[](local_88,local_bc);
              local_c4 = pLVar6->x;
              local_bd = (uint8_t)value(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
              lbool::lbool(&local_c5,'\x01');
              bVar3 = lbool::operator!=((lbool *)CONCAT44(in_stack_fffffffffffffe9c,
                                                          in_stack_fffffffffffffe98),
                                        (lbool)(uint8_t)((ulong)in_stack_fffffffffffffea0 >> 0x38));
              if (bVar3) {
                iVar5 = decisionLevel((Solver *)0x1208bf);
                iVar4 = vec<Glucose::Lit>::size(&in_RDI->assumptions);
                if (iVar4 < iVar5) {
                  local_b8 = local_bc;
                  break;
                }
                local_b8 = local_bc;
                pLVar6 = Clause::operator[](local_88,local_bc);
                local_cc = pLVar6->x;
                local_c6 = value(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
                lbool::lbool(&local_cd,'\0');
                bVar3 = lbool::operator==(&local_c6,local_cd);
                local_135 = 1;
                if (!bVar3) {
                  pLVar6 = Clause::operator[](local_88,local_bc);
                  local_d4 = pLVar6->x;
                  iVar5 = var((Lit)local_d4);
                  bVar3 = isSelector(in_RDI,iVar5);
                  local_135 = bVar3 ^ 0xff;
                }
                if ((local_135 & 1) != 0) break;
              }
            }
            if (local_b8 != -1) {
              pLVar6 = Clause::operator[](local_88,local_b8);
              pLVar8 = Clause::operator[](local_88,1);
              pLVar8->x = pLVar6->x;
              pLVar6 = Clause::operator[](local_88,local_b8);
              pLVar6->x = local_8c.x;
              pLVar6 = Clause::operator[](local_88,1);
              local_dc = pLVar6->x;
              local_d8 = (int)operator~((Lit)local_dc);
              OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
              ::operator[]((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
                            *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0.x),
                           (Lit *)in_stack_fffffffffffffea8);
              vec<Glucose::Solver::Watcher>::push
                        (in_stack_fffffffffffffea0,
                         (Watcher *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
              goto LAB_0012057e;
            }
          }
          WVar2.blocker.x = in_stack_ffffffffffffff64.x;
          WVar2.cref = local_a0;
          *local_38 = WVar2;
          local_fc = local_98.x;
          local_38 = local_38 + 1;
          local_f5 = value(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
          lbool::lbool(&local_fd,'\x01');
          bVar3 = lbool::operator==(&local_f5,local_fd);
          if (bVar3) {
            local_14 = local_7c;
            iVar5 = vec<Glucose::Lit>::size(&in_RDI->trail);
            in_RDI->qhead = iVar5;
            while (local_30 < local_40) {
              *local_38 = *local_30;
              local_38 = local_38 + 1;
              local_30 = local_30 + 1;
            }
          }
          else {
            uncheckedEnqueue(in_stack_fffffffffffffed8,
                             (Lit)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                             in_stack_fffffffffffffed4);
          }
          goto LAB_0012057e;
        }
        WVar1.blocker.x = in_stack_ffffffffffffff64.x;
        WVar1.cref = local_a0;
        *local_38 = WVar1;
        local_38 = local_38 + 1;
      }
      goto LAB_0012057e;
    }
    vec<Glucose::Solver::Watcher>::shrink(local_28,(int)((long)local_30 - (long)local_38 >> 3));
    if (((in_RDI->useUnaryWatched & 1U) != 0) && (local_14 == 0xffffffff)) {
      local_14 = propagateUnaryWatches
                           ((Solver *)
                            CONCAT44(in_stack_ffffffffffffff5c.x,in_stack_ffffffffffffff58.x),
                            in_stack_ffffffffffffff64);
    }
  } while( true );
}

Assistant:

CRef Solver::propagate() {
    CRef confl = CRef_Undef;
    int num_props = 0;
    watches.cleanAll();
    watchesBin.cleanAll();
    unaryWatches.cleanAll();
    while(qhead < trail.size()) {
        Lit p = trail[qhead++]; // 'p' is enqueued fact to propagate.
        vec <Watcher> &ws = watches[p];
        Watcher *i, *j, *end;
        num_props++;


        // First, Propagate binary clauses
        vec <Watcher> &wbin = watchesBin[p];
        for(int k = 0; k < wbin.size(); k++) {

            Lit imp = wbin[k].blocker;

            if(value(imp) == l_False) {
                return wbin[k].cref;
            }

            if(value(imp) == l_Undef) {
                uncheckedEnqueue(imp, wbin[k].cref);
            }
        }

        // Now propagate other 2-watched clauses
        for(i = j = (Watcher *) ws, end = i + ws.size(); i != end;) {
            // Try to avoid inspecting the clause:
            Lit blocker = i->blocker;
            if(value(blocker) == l_True) {
                *j++ = *i++;
                continue;
            }

            // Make sure the false literal is data[1]:
            CRef cr = i->cref;
            Clause &c = ca[cr];
            assert(!c.getOneWatched());
            Lit false_lit = ~p;
            if(c[0] == false_lit)
                c[0] = c[1], c[1] = false_lit;
            assert(c[1] == false_lit);
            i++;

            // If 0th watch is true, then clause is already satisfied.
            Lit first = c[0];
            Watcher w = Watcher(cr, first);
            if(first != blocker && value(first) == l_True) {

                *j++ = w;
                continue;
            }
#ifdef INCREMENTAL
            if(incremental) { // ----------------- INCREMENTAL MODE
              int choosenPos = -1;
              for (int k = 2; k < c.size(); k++) {

            if (value(c[k]) != l_False){
              if(decisionLevel()>assumptions.size()) {
                choosenPos = k;
                break;
              } else {
                choosenPos = k;

                if(value(c[k])==l_True || !isSelector(var(c[k]))) {
                  break;
                }
              }

            }
              }
              if(choosenPos!=-1) {
            c[1] = c[choosenPos]; c[choosenPos] = false_lit;
            watches[~c[1]].push(w);
            goto NextClause; }
            } else {  // ----------------- DEFAULT  MODE (NOT INCREMENTAL)
#endif
            for(int k = 2; k < c.size(); k++) {

                if(value(c[k]) != l_False) {
                    c[1] = c[k];
                    c[k] = false_lit;
                    watches[~c[1]].push(w);
                    goto NextClause;
                }
            }
#ifdef INCREMENTAL
            }
#endif
            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if(value(first) == l_False) {
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while(i < end)
                    *j++ = *i++;
            } else {
                uncheckedEnqueue(first, cr);


            }
            NextClause:;
        }
        ws.shrink(i - j);

        // unaryWatches "propagation"
        if(useUnaryWatched && confl == CRef_Undef) {
            confl = propagateUnaryWatches(p);

        }

    }


    propagations += num_props;
    simpDB_props -= num_props;

    return confl;
}